

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::initDynamicTestLists(Builder builder)

{
  Reader *pRVar1;
  long lVar2;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  initializer_list<capnp::DynamicValue::Reader> value;
  initializer_list<capnp::DynamicValue::Reader> value_00;
  initializer_list<capnp::DynamicValue::Reader> value_01;
  initializer_list<capnp::DynamicValue::Reader> value_02;
  initializer_list<capnp::DynamicValue::Reader> value_03;
  initializer_list<capnp::DynamicValue::Reader> value_04;
  BuilderFor<capnp::DynamicList> l_2;
  BuilderFor<capnp::DynamicList> l;
  BuilderFor<capnp::DynamicStruct> lists;
  Builder BStack_408;
  Builder local_3c8;
  undefined1 local_388 [56];
  BuilderFor<DynamicStruct> local_350;
  Reader local_320;
  undefined1 local_2d8 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 local_2d0;
  undefined4 local_290;
  undefined8 local_288;
  BuilderFor<DynamicStruct> local_248;
  EVP_PKEY_CTX local_218 [48];
  Builder local_1e8;
  Builder local_1a8;
  Builder local_168;
  Builder local_128;
  Builder local_e8;
  Builder local_a8;
  Builder local_68;
  
  DynamicStruct::Builder::init((Builder *)&local_320,local_218);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_248,(Builder *)&local_320);
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicStruct::Builder::init((Builder *)&local_68,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_68);
  DynamicStruct::Builder::init((Builder *)&local_a8,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_a8);
  DynamicStruct::Builder::init((Builder *)&local_e8,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_e8);
  DynamicStruct::Builder::init((Builder *)&local_128,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_128);
  DynamicStruct::Builder::init((Builder *)&local_168,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_168);
  DynamicStruct::Builder::init((Builder *)&local_1a8,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_1a8);
  DynamicStruct::Builder::init((Builder *)&local_1e8,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::~Builder(&local_1e8);
  name.content.size_ = 6;
  name.content.ptr = "list0";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = VOID;
  name_15.content.size_ = 2;
  name_15.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_15,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_00.content.size_ = 6;
  name_00.content.ptr = "list0";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_00);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = VOID;
  name_16.content.size_ = 2;
  name_16.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_16,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_01.content.size_ = 6;
  name_01.content.ptr = "list1";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_01);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = BOOL;
  local_320.field_1.boolValue = true;
  name_17.content.size_ = 2;
  name_17.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_17,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_02.content.size_ = 6;
  name_02.content.ptr = "list1";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_02);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = BOOL;
  local_320.field_1.boolValue = false;
  name_18.content.size_ = 2;
  name_18.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_18,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_03.content.size_ = 6;
  name_03.content.ptr = "list1";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_03);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,2);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = BOOL;
  local_320.field_1.boolValue = true;
  name_19.content.size_ = 2;
  name_19.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_19,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_04.content.size_ = 6;
  name_04.content.ptr = "list1";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_04);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,3);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = BOOL;
  local_320.field_1.boolValue = (bool)1;
  name_20.content.size_ = 2;
  name_20.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_20,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_05.content.size_ = 6;
  name_05.content.ptr = "list8";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_05);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.intValue = 0x7b;
  name_21.content.size_ = 2;
  name_21.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_21,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_06.content.size_ = 6;
  name_06.content.ptr = "list8";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_06);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.intValue = 0x2d;
  name_22.content.size_ = 2;
  name_22.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_22,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_07.content.size_ = 7;
  name_07.content.ptr = "list16";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_07);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 6.09924039791019e-320;
  name_23.content.size_ = 2;
  name_23.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_23,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_08.content.size_ = 7;
  name_08.content.ptr = "list16";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_08);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 3.35421166961622e-320;
  name_24.content.size_ = 2;
  name_24.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_24,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_09.content.size_ = 7;
  name_09.content.ptr = "list32";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_09);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 6.09957581907715e-316;
  name_25.content.size_ = 2;
  name_25.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_25,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_10.content.size_ = 7;
  name_10.content.ptr = "list32";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_10);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 1.15891936066468e-315;
  name_26.content.size_ = 2;
  name_26.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_26,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_11.content.size_ = 7;
  name_11.content.ptr = "list64";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_11);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 6.099575819687104e-309;
  name_27.content.size_ = 2;
  name_27.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_27,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_12.content.size_ = 7;
  name_12.content.ptr = "list64";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_12);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = UINT;
  local_320.field_1.floatValue = 1.158919361274642e-308;
  name_28.content.size_ = 2;
  name_28.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_28,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_13.content.size_ = 6;
  name_13.content.ptr = "listP";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_13);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = TEXT;
  local_320.field_1.floatValue = (double)((long)"imported-foo" + 9);
  local_320.field_1.textValue.super_StringPtr.content.size_ = 4;
  name_29.content.size_ = 2;
  name_29.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_29,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  name_14.content.size_ = 6;
  name_14.content.ptr = "listP";
  DynamicStruct::Builder::get(&local_3c8,&local_248,name_14);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&local_3c8);
  DynamicList::Builder::operator[](&BStack_408,(Builder *)local_388,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_350,&BStack_408)
  ;
  local_320.type = TEXT;
  local_320.field_1.floatValue = (double)((long)"foo\n\r\t\vbar" + 7);
  local_320.field_1.textValue.super_StringPtr.content.size_ = 4;
  name_30.content.size_ = 2;
  name_30.content.ptr = "f";
  DynamicStruct::Builder::set(&local_350,name_30,&local_320);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicValue::Builder::~Builder(&local_3c8);
  DynamicStruct::Builder::init((Builder *)&local_320,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_3c8,(Builder *)&local_320);
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = INT;
  local_320.field_1.intValue = 1;
  local_2d8._0_4_ = INT;
  local_2d0.intValue = 2;
  local_290 = 3;
  local_288 = 3;
  value._M_len = 3;
  value._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value);
  lVar2 = 0x90;
  do {
    DynamicValue::Reader::~Reader((Reader *)((long)&local_320.type + lVar2));
    lVar2 = lVar2 + -0x48;
  } while (lVar2 != -0x48);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = INT;
  local_320.field_1.intValue = 4;
  local_2d8._0_4_ = INT;
  local_2d0.intValue = 5;
  value_00._M_len = 2;
  value_00._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value_00);
  pRVar1 = (Reader *)local_2d8;
  lVar2 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar1);
    lVar2 = lVar2 + 0x48;
    pRVar1 = pRVar1 + -1;
  } while (lVar2 != 0x90);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = INT;
  local_320.field_1.floatValue = 6.09737974668795e-317;
  value_01._M_len = 1;
  value_01._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value_01);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicStruct::Builder::init((Builder *)&local_320,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_3c8,(Builder *)&local_320);
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = TEXT;
  local_320.field_1.floatValue = (double)((long)"imported-foo" + 9);
  local_320.field_1.textValue.super_StringPtr.content.size_ = 4;
  local_2d8._0_4_ = TEXT;
  local_2d0.floatValue = (double)((long)"foo\n\r\t\vbar" + 7);
  local_2d0.textValue.super_StringPtr.content.size_ = 4;
  value_02._M_len = 2;
  value_02._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value_02);
  pRVar1 = (Reader *)local_2d8;
  lVar2 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar1);
    lVar2 = lVar2 + 0x48;
    pRVar1 = pRVar1 + -1;
  } while (lVar2 != 0x90);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = TEXT;
  local_320.field_1.floatValue = (double)((long)"foo\n\tbaz" + 5);
  local_320.field_1.textValue.super_StringPtr.content.size_ = 4;
  value_03._M_len = 1;
  value_03._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value_03);
  DynamicValue::Reader::~Reader(&local_320);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicList::Builder::init((Builder *)&BStack_408,(EVP_PKEY_CTX *)&local_3c8);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,&BStack_408);
  local_320.type = TEXT;
  local_320.field_1.floatValue = (double)((long)"[foo, (bar, baz)] qux" + 0x12);
  local_320.field_1.textValue.super_StringPtr.content.size_ = 4;
  local_2d8._0_4_ = TEXT;
  local_2d0.floatValue = 2.50442419349138e-317;
  local_2d0.textValue.super_StringPtr.content.size_ = 6;
  value_04._M_len = 2;
  value_04._M_array = &local_320;
  DynamicList::Builder::copyFrom((Builder *)local_388,value_04);
  pRVar1 = (Reader *)local_2d8;
  lVar2 = 0;
  do {
    DynamicValue::Reader::~Reader(pRVar1);
    lVar2 = lVar2 + 0x48;
    pRVar1 = pRVar1 + -1;
  } while (lVar2 != 0x90);
  DynamicValue::Builder::~Builder(&BStack_408);
  DynamicStruct::Builder::init((Builder *)&local_320,(EVP_PKEY_CTX *)&local_248);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&BStack_408,(Builder *)&local_320);
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::init((Builder *)&local_320,(EVP_PKEY_CTX *)&BStack_408);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)&local_3c8,(Builder *)&local_320);
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::operator[]((Builder *)&local_320,(Builder *)&local_3c8,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_388,(Builder *)&local_320);
  Schema::requireUsableAs((Schema *)local_388,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_388._24_8_ + 4))->upper32Bits = 0x7b;
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::operator[]((Builder *)&local_320,(Builder *)&local_3c8,1);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_388,(Builder *)&local_320);
  Schema::requireUsableAs((Schema *)local_388,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_388._24_8_ + 4))->upper32Bits = 0x1c8;
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::init((Builder *)&local_320,(EVP_PKEY_CTX *)&BStack_408);
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicList> *)local_388,(Builder *)&local_320);
  local_3c8.field_1._40_8_ = local_388._48_8_;
  local_3c8.field_1.listValue.builder.capTable = (CapTableBuilder *)local_388._32_8_;
  local_3c8.field_1.listValue.builder.ptr = (byte *)local_388._40_8_;
  local_3c8.field_1.textValue.content.ptr = (char *)local_388._16_8_;
  local_3c8.field_1.anyPointerValue.builder.pointer = (WirePointer *)local_388._24_8_;
  local_3c8._0_8_ = local_388._0_8_;
  local_3c8.field_1.intValue = local_388._8_8_;
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  DynamicList::Builder::operator[]((Builder *)&local_320,(Builder *)&local_3c8,0);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_388,(Builder *)&local_320);
  Schema::requireUsableAs((Schema *)local_388,(RawSchema *)schemas::s_a0a8f314b80b63fd);
  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)(local_388._24_8_ + 4))->upper32Bits = 0x315;
  DynamicValue::Builder::~Builder((Builder *)&local_320);
  return;
}

Assistant:

void initDynamicTestLists(DynamicStruct::Builder builder) {
  dynamicInitListDefaults(builder);
}